

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::deregister_coop
          (mt_env_infrastructure_t *this,nonempty_name_t *name,coop_dereg_reason_t dereg_reason)

{
  nonempty_name_t local_40;
  nonempty_name_t *local_20;
  nonempty_name_t *name_local;
  mt_env_infrastructure_t *this_local;
  coop_dereg_reason_t dereg_reason_local;
  
  local_20 = name;
  name_local = (nonempty_name_t *)this;
  this_local._4_4_ = dereg_reason.m_reason;
  nonempty_name_t::nonempty_name_t(&local_40,name);
  so_5::impl::coop_repository_basis_t::deregister_coop
            (&(this->m_coop_repo).super_coop_repository_basis_t,&local_40,this_local._4_4_);
  nonempty_name_t::~nonempty_name_t(&local_40);
  return;
}

Assistant:

void
mt_env_infrastructure_t::deregister_coop(
	nonempty_name_t name,
	coop_dereg_reason_t dereg_reason )
	{
		m_coop_repo.deregister_coop( std::move(name), dereg_reason );
	}